

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O3

Type __thiscall
rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::PushBack<unsigned_long>
          (GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *this,unsigned_long value,
          CrtAllocator *allocator)

{
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *pGVar1;
  ushort uVar2;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> v;
  Data local_18;
  
  uVar2 = (ushort)((value & 0xffffffff80000000) == 0) << 5 | 0x1d6;
  if (value >> 0x20 != 0) {
    uVar2 = (ushort)(-1 < (long)value) << 7 | 0x116;
  }
  local_18.s.str = (Ch *)((ulong)uVar2 << 0x30);
  local_18.n = (Number)value;
  pGVar1 = PushBack(this,(GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)&local_18.s
                    ,allocator);
  ~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)&local_18.s);
  return pGVar1;
}

Assistant:

PushBack(T value, Allocator& allocator) {
        GenericValue v(value);
        return PushBack(v, allocator);
    }